

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_xswiftec_var(secp256k1_fe *x,secp256k1_fe *u,secp256k1_fe *t)

{
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_fe sStack_68;
  secp256k1_fe local_40;
  
  secp256k1_ellswift_xswiftec_frac_var(&local_40,&sStack_68,u,t);
  secp256k1_fe_impl_inv_var(&sStack_68,&sStack_68);
  secp256k1_fe_impl_mul(x,&local_40,&sStack_68);
  return;
}

Assistant:

static void secp256k1_ellswift_xswiftec_var(secp256k1_fe *x, const secp256k1_fe *u, const secp256k1_fe *t) {
    secp256k1_fe xn, xd;
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, u, t);
    secp256k1_fe_inv_var(&xd, &xd);
    secp256k1_fe_mul(x, &xn, &xd);
}